

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,char **arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3)

{
  string_view data;
  string_view format_00;
  _Alloc_hider in_stack_fffffffffffffef0;
  size_t local_108;
  Arg local_f0;
  Arg local_c0;
  Arg local_90;
  size_type local_60;
  pointer local_58;
  
  format_00._M_len = format._M_str;
  local_58 = (arg->_M_dataplus)._M_p;
  local_60 = arg->_M_string_length;
  local_90.piece_ = absl::lts_20250127::NullSafeStringView(*arg_1);
  local_c0.piece_._M_str = (arg_2->_M_dataplus)._M_p;
  local_c0.piece_._M_len = arg_2->_M_string_length;
  local_f0.piece_._M_str = (arg_3->_M_dataplus)._M_p;
  local_f0.piece_._M_len = arg_3->_M_string_length;
  format_00._M_str = (char *)&local_60;
  absl::lts_20250127::Substitute_abi_cxx11_
            ((string *)&stack0xfffffffffffffef0,(lts_20250127 *)format._M_len,format_00,&local_90,
             &local_c0,&local_f0,(Arg *)in_stack_fffffffffffffef0._M_p);
  data._M_str = in_stack_fffffffffffffef0._M_p;
  data._M_len = local_108;
  Write(this,data);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }